

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_plus.c
# Opt level: O2

MPP_RET hal_avsd_plus_init(void *decoder,MppHalCfg *cfg)

{
  MPP_RET MVar1;
  void *pvVar2;
  
  if (((byte)avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_plus","AVS_plus In.","hal_avsd_plus_init");
  }
  MVar1 = mpp_buffer_get_with_tag
                    (*(MppBufferGroup *)((long)decoder + 0x68),(MppBuffer *)((long)decoder + 0x1b0),
                     0x3fc000,"hal_avsd_plus","hal_avsd_plus_init");
  if (MVar1 < MPP_OK) {
    if (((byte)avsd_hal_debug & 4) != 0) {
      _mpp_log_l(4,"hal_avsd_plus","Function error(%d).\n",(char *)0x0,0x255);
    }
  }
  else {
    pvVar2 = mpp_osal_calloc("hal_avsd_plus_init",0xf0);
    *(void **)((long)decoder + 0x1a0) = pvVar2;
    if (pvVar2 == (void *)0x0) {
      _mpp_log_l(2,"hal_avsd_plus","malloc buffer error(%d).\n","hal_avsd_plus_init",600);
      MVar1 = MPP_ERR_MALLOC;
    }
    else {
      mpp_slots_set_prop(*(MppBufSlots *)((long)decoder + 0x58),SLOTS_HOR_ALIGN,avsd_hor_align);
      mpp_slots_set_prop(*(MppBufSlots *)((long)decoder + 0x58),SLOTS_VER_ALIGN,avsd_ver_align);
      mpp_slots_set_prop(*(MppBufSlots *)((long)decoder + 0x58),SLOTS_LEN_ALIGN,avsd_len_align);
      *(undefined4 *)((long)decoder + 0x1a8) = 0x3c;
      *(undefined8 *)((long)decoder + 0x1fc) = 1;
      *(undefined8 *)((long)decoder + 0x1c0) = 0;
      *(undefined8 *)((long)decoder + 0x1c8) = 0;
      *(undefined8 *)((long)decoder + 0x1d0) = 0;
      *(undefined8 *)((long)decoder + 0x1d8) = 0;
      *(undefined8 *)((long)decoder + 0x1e0) = 0;
      *(undefined8 *)((long)decoder + 0x1e8) = 0;
      *(undefined8 *)((long)decoder + 0x1ec) = 0;
      *(undefined8 *)((long)decoder + 500) = 0;
      *(undefined4 *)((long)decoder + 0x214) = 0xffffffff;
      *(undefined8 *)((long)decoder + 0x20c) = 0xffffffffffffffff;
      *(MppHalCfg **)((long)decoder + 0x1b8) = cfg;
      MVar1 = MPP_OK;
      if (((byte)avsd_hal_debug & 8) != 0) {
        MVar1 = MPP_OK;
        _mpp_log_l(4,"hal_avsd_plus","Out.","hal_avsd_plus_init");
      }
    }
  }
  return MVar1;
}

Assistant:

MPP_RET hal_avsd_plus_init(void *decoder, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_U32 buf_size = 0;
    AvsdHalCtx_t *p_hal = (AvsdHalCtx_t *)decoder;

    AVSD_HAL_TRACE("AVS_plus In.");

    buf_size = (1920 * 1088) * 2;
    FUN_CHECK(ret = mpp_buffer_get(p_hal->buf_group, &p_hal->mv_buf, buf_size));

    p_hal->p_regs = mpp_calloc_size(RK_U32, sizeof(AvsdPlusRegs_t));
    MEM_CHECK(ret, p_hal->p_regs);

    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_HOR_ALIGN, avsd_hor_align);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_VER_ALIGN, avsd_ver_align);
    mpp_slots_set_prop(p_hal->frame_slots, SLOTS_LEN_ALIGN, avsd_len_align);

    p_hal->regs_num = 60;
    //!< initial for control
    p_hal->first_field = 1;
    p_hal->prev_pic_structure = 0; //!< field

    memset(p_hal->pic, 0, sizeof(p_hal->pic));
    p_hal->work_out = -1;
    p_hal->work0 = -1;
    p_hal->work1 = -1;
    p_hal->cfg = cfg;

    AVSD_HAL_TRACE("Out.");
    return ret = MPP_OK;
__FAILED:
    return ret;
}